

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fLifetimeTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::anon_unknown_0::TestGroup::init(TestGroup *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Context *pCVar3;
  int extraout_EAX;
  ES2Types *this_00;
  ES2Types *types;
  Context local_28;
  
  pCVar3 = (this->super_TestCaseGroup).m_context;
  uVar1 = pCVar3->m_testCtx;
  uVar2 = pCVar3->m_renderCtx;
  local_28.m_testCtx._0_4_ = (int)uVar1;
  local_28.m_renderCtx = (RenderContext *)uVar2;
  local_28.m_testCtx._4_4_ = (int)((ulong)uVar1 >> 0x20);
  this_00 = (ES2Types *)operator_new(0x5e8);
  deqp::gls::LifetimeTests::details::ES2Types::ES2Types(this_00,&local_28);
  types = (ES2Types *)
          (this->m_types).
          super_UniqueBase<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
          .m_data.ptr;
  if (types != this_00) {
    if (types != (ES2Types *)0x0) {
      (*(types->super_Types)._vptr_Types[2])();
    }
    (this->m_types).
    super_UniqueBase<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
    .m_data.ptr = (Types *)this_00;
    types = this_00;
  }
  deqp::gls::LifetimeTests::details::addTestCases((TestCaseGroup *)this,&types->super_Types);
  return extraout_EAX;
}

Assistant:

void TestGroup::init (void)
{
	gles2::Context&	ctx		= getContext();
	lt::Context		ltCtx	(ctx.getRenderContext(), ctx.getTestContext());

	m_types = MovePtr<Types>(new ES2Types(ltCtx));
	addTestCases(*this, *m_types);
}